

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IStream * __thiscall Catch::Config::openStream(Config *this)

{
  bool bVar1;
  ulong uVar2;
  CoutStream *this_00;
  char *pcVar3;
  DebugOutStream *this_01;
  domain_error *this_02;
  FileStream *this_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  Config *local_18;
  Config *this_local;
  
  local_18 = this;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&(this->m_data).outputFilename);
    if (*pcVar3 == '%') {
      bVar1 = std::operator==(&(this->m_data).outputFilename,"%debug");
      if (!bVar1) {
        this_02 = (domain_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_48,"Unrecognised stream: ",&(this->m_data).outputFilename);
        std::domain_error::domain_error(this_02,(string *)&local_48);
        __cxa_throw(this_02,&std::domain_error::typeinfo,std::domain_error::~domain_error);
      }
      this_01 = (DebugOutStream *)operator_new(0x120);
      DebugOutStream::DebugOutStream(this_01);
      this_local = (Config *)this_01;
    }
    else {
      this_03 = (FileStream *)operator_new(0x208);
      FileStream::FileStream(this_03,&(this->m_data).outputFilename);
      this_local = (Config *)this_03;
    }
  }
  else {
    this_00 = (CoutStream *)operator_new(0x118);
    CoutStream::CoutStream(this_00);
    this_local = (Config *)this_00;
  }
  return (IStream *)this_local;
}

Assistant:

IStream const* openStream() {
            if( m_data.outputFilename.empty() )
                return new CoutStream();
            else if( m_data.outputFilename[0] == '%' ) {
                if( m_data.outputFilename == "%debug" )
                    return new DebugOutStream();
                else
                    throw std::domain_error( "Unrecognised stream: " + m_data.outputFilename );
            }
            else
                return new FileStream( m_data.outputFilename );
        }